

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cc
# Opt level: O2

event * helix::make_trade_event
                  (event *__return_storage_ptr__,string *symbol,uint64_t timestamp,trade *t,
                  event_mask mask)

{
  __return_storage_ptr__->_mask = mask | 2;
  std::__cxx11::string::string((string *)&__return_storage_ptr__->_symbol,(string *)symbol);
  __return_storage_ptr__->_timestamp = timestamp;
  __return_storage_ptr__->_ob = (order_book *)0x0;
  __return_storage_ptr__->_trade = t;
  return __return_storage_ptr__;
}

Assistant:

event make_trade_event(const std::string& symbol, uint64_t timestamp, trade* t, event_mask mask)
{
    return event{mask | ev_trade, symbol, timestamp, nullptr, t};
}